

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

void extents_remove_locked(tsdn_t *tsdn,extents_t *extents,extent_t *extent)

{
  cache_bin_sz_t *pcVar1;
  void ***pppvVar2;
  cache_bin_t *pcVar3;
  cache_bin_stats_t *pcVar4;
  witness_comp_t *pwVar5;
  extents_t *peVar6;
  witness_t *pwVar7;
  long lVar8;
  size_t sVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uintptr_t *ph;
  ulong size;
  
  pwVar5 = (extents->mtx).field_0.witness.comp;
  size = (ulong)pwVar5 & 0xfffffffffffff000;
  sVar9 = extent_size_quantize_floor(size);
  if (sVar9 < 0x7000000000000001) {
    uVar13 = sVar9 * 2 - 1;
    lVar8 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    uVar11 = (uint)lVar8;
    iVar12 = uVar11 - 0xe;
    if (uVar11 < 0xe) {
      iVar12 = 0;
    }
    bVar10 = 0xc;
    if (0xe < uVar11) {
      bVar10 = (char)lVar8 - 3;
    }
    uVar13 = (ulong)(((uint)(((sVar9 - 1 >> (bVar10 & 0x3f)) << (bVar10 & 0x3f)) >> (bVar10 & 0x3f))
                     & 3) + iVar12 * 4);
  }
  else {
    uVar13 = 199;
  }
  ph = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx.cache[4].leafkey
       + uVar13;
  extent_heap_remove((extent_heap_t *)ph,(extent_t *)extents);
  pcVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large[9].
            low_water + uVar13 * 2;
  *(long *)pcVar1 = *(long *)pcVar1 + -1;
  pppvVar2 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large
              [0x4b].avail + uVar13;
  *pppvVar2 = (void **)((long)*pppvVar2 - size);
  if (*ph == 0) {
    pcVar4 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large
              [0x8e].tstats + (uVar13 >> 6);
    pcVar4->nrequests = pcVar4->nrequests ^ 1L << ((byte)uVar13 & 0x3f);
  }
  peVar6 = (extents_t *)
           (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large[0x8f]
           .avail;
  if (peVar6 == extents) {
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large[0x8f].avail
         = (void **)(peVar6->mtx).field_0.field_0.prof_data.n_spin_acquired;
  }
  if ((extents_t *)
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large[0x8f].
      avail == extents) {
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large[0x8f].avail
         = (void **)0x0;
  }
  else {
    pwVar7 = (extents->mtx).field_0.witness.link.qre_next;
    pwVar7->opaque = (void *)(extents->mtx).field_0.field_0.prof_data.n_spin_acquired;
    *(witness_t **)((long)(extents->mtx).field_0.witness.opaque + 0x20) = pwVar7;
    (extents->mtx).field_0.witness.opaque = extents;
    (extents->mtx).field_0.witness.link.qre_next = (witness_t *)extents;
  }
  pcVar3 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large +
           0x90;
  *(ulong *)pcVar3 = *(long *)pcVar3 - ((ulong)pwVar5 >> 0xc);
  return;
}

Assistant:

static void
extents_remove_locked(tsdn_t *tsdn, extents_t *extents, extent_t *extent) {
	malloc_mutex_assert_owner(tsdn, &extents->mtx);
	assert(extent_state_get(extent) == extents->state);

	size_t size = extent_size_get(extent);
	size_t psz = extent_size_quantize_floor(size);
	pszind_t pind = sz_psz2ind(psz);
	extent_heap_remove(&extents->heaps[pind], extent);

	if (config_stats) {
		extents_stats_sub(extents, pind, size);
	}

	if (extent_heap_empty(&extents->heaps[pind])) {
		bitmap_set(extents->bitmap, &extents_bitmap_info,
		    (size_t)pind);
	}
	extent_list_remove(&extents->lru, extent);
	size_t npages = size >> LG_PAGE;
	/*
	 * As in extents_insert_locked, we hold extents->mtx and so don't need
	 * atomic operations for updating extents->npages.
	 */
	size_t cur_extents_npages =
	    atomic_load_zu(&extents->npages, ATOMIC_RELAXED);
	assert(cur_extents_npages >= npages);
	atomic_store_zu(&extents->npages,
	    cur_extents_npages - (size >> LG_PAGE), ATOMIC_RELAXED);
}